

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<unsigned_long,unsigned_long>
                   (string *fmt,unsigned_long *args,unsigned_long *args_1)

{
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  ostringstream *this;
  char *in_stack_fffffffffffffe50;
  ostream *in_stack_fffffffffffffe58;
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_180;
  std::__cxx11::ostringstream::ostringstream(this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            (in_stack_fffffffffffffe28);
  format<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,(unsigned_long *)this,
             (unsigned_long *)in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const std::string &fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt.c_str(), args...);
    return oss.str();
}